

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O0

void __thiscall
tcu::TestNode::TestNode
          (TestNode *this,TestContext *testCtx,TestNodeType nodeType,char *name,char *description)

{
  char *__s;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  char *local_30;
  char *description_local;
  char *name_local;
  TestContext *pTStack_18;
  TestNodeType nodeType_local;
  TestContext *testCtx_local;
  TestNode *this_local;
  
  this->_vptr_TestNode = (_func_int **)&PTR__TestNode_0168c260;
  this->m_testCtx = testCtx;
  local_30 = description;
  description_local = name;
  name_local._4_4_ = nodeType;
  pTStack_18 = testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,name,&local_31);
  std::allocator<char>::~allocator(&local_31);
  __s = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_description,__s,local_45);
  std::allocator<char>::~allocator(local_45);
  this->m_nodeType = name_local._4_4_;
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::vector(&this->m_children);
  return;
}

Assistant:

TestNode::TestNode (TestContext& testCtx, TestNodeType nodeType, const char* name, const char* description)
	: m_testCtx		(testCtx)
	, m_name		(name)
	, m_description	(description)
	, m_nodeType	(nodeType)
{
	DE_ASSERT(isValidCaseName(name));
}